

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

int __thiscall luna::Function::AddChildFunction(Function *this,Function *child)

{
  Function *local_10;
  
  local_10 = child;
  std::vector<luna::Function_*,_std::allocator<luna::Function_*>_>::push_back
            (&this->child_funcs_,&local_10);
  return (int)((ulong)((long)(this->child_funcs_).
                             super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->child_funcs_).
                            super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
}

Assistant:

int Function::AddChildFunction(Function *child)
    {
        child_funcs_.push_back(child);
        return child_funcs_.size() - 1;
    }